

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

char * string_feeder_next_length(string_feeder_t *sf,size_t length)

{
  ulong uVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (sf == (string_feeder_t *)0x0) {
    __assert_fail("sf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x1f6,"char *string_feeder_next_length(string_feeder_t *, size_t)");
  }
  uVar4 = sf->len;
  uVar1 = sf->pos;
  if (uVar1 <= uVar4) {
    uVar5 = uVar4 - uVar1;
    if (uVar1 + length <= uVar4) {
      uVar5 = length;
    }
    pcVar3 = (char *)calloc(uVar5 + 1,1);
    if (uVar5 != 0) {
      uVar4 = 0;
      do {
        cVar2 = string_feeder_next(sf);
        pcVar3[uVar4] = cVar2;
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar5);
    }
    return pcVar3;
  }
  __assert_fail("sf->pos <= sf->len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x1f8,"char *string_feeder_next_length(string_feeder_t *, size_t)");
}

Assistant:

char *string_feeder_next_length(string_feeder_t *sf, size_t length)
{
    assert(sf != NULL);
    assert(length >= 0);
    assert(sf->pos <= sf->len);

    if (sf->pos + length > sf->len)
        length = sf->len - sf->pos;

    char *substr = calloc(length+1, sizeof(char));
    for (int i = 0 ; i < length ; i++)
        substr[i] = string_feeder_next(sf);
    return substr;
}